

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_edge_cases.cpp
# Opt level: O0

bool test_uintwide_t_edge::test_export_bits(void)

{
  undefined1 *this;
  allocator<unsigned_short> *this_00;
  bool bVar1;
  unsigned_long uVar2;
  const_iterator pvVar3;
  iterator pvVar4;
  const_iterator __first1;
  const_iterator __last1;
  const_iterator __first2;
  const_iterator pvVar5;
  pointer puVar6;
  iterator iVar7;
  const_iterator __first1_00;
  const_iterator __last1_00;
  const_iterator __first2_00;
  iterator pvVar8;
  const_iterator __first1_01;
  const_iterator __last1_01;
  const_iterator __first2_01;
  uintwide_t<256U,_unsigned_short,_void,_false> *x;
  uintwide_t<256U,_unsigned_short,_void,_false> *x_00;
  uintwide_t<256U,_unsigned_short,_void,_false> *x_01;
  int in_R8D;
  bool local_462;
  bool local_449;
  bool local_429;
  bool local_3b1;
  uint local_394;
  uint uStack_390;
  bool result_is_one_and_compare_one_is_ok;
  local_result_type result_one_boost;
  local_result_type result_one_uintwide_t;
  local_boost_small_uint_type val_boost_3;
  undefined1 local_34a [8];
  local_uintwide_t_small_signed_type val_uintwide_t_3;
  bool result_export_bits_is_ok_2;
  local_double_width_output_array_type bits_result_double_width_from_boost;
  local_double_width_output_array_type bits_result_double_width_from_uintwide_t;
  undefined1 local_2c8 [8];
  local_boost_small_uint_type val_boost_2;
  undefined1 local_28c [8];
  uintwide_t<256U,_unsigned_short,_void,_false> val_uintwide_t_2;
  uint i_2;
  value_type_conflict1 *msv_first_2;
  const_iterator __end1_2;
  const_iterator __begin1_2;
  array<bool,_2UL> *__range1_2;
  bool result_export_bits_is_ok_1;
  allocator<unsigned_short> local_203;
  value_type_conflict3 local_202;
  undefined1 local_200 [8];
  local_output_vector_type bits_result_from_boost_1;
  undefined1 local_1e0 [8];
  local_output_vector_type bits_result_from_uintwide_t_1;
  size_t output_distance;
  undefined1 local_1b8 [7];
  bool output_distance_chunk_size_has_mod;
  undefined1 local_198 [8];
  local_boost_small_uint_type val_boost_1;
  undefined1 local_15c [8];
  uintwide_t<256U,_unsigned_short,_void,_false> val_uintwide_t_1;
  uint i_1;
  value_type_conflict *chunk_size;
  const_iterator __end2;
  const_iterator __begin2;
  array<unsigned_int,_3UL> *__range2;
  value_type_conflict1 *msv_first_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  array<bool,_2UL> *__range1_1;
  bool result_export_bits_is_ok;
  local_output_array_type bits_result_from_boost;
  local_output_array_type bits_result_from_uintwide_t;
  string local_a8;
  undefined1 local_88 [8];
  local_boost_small_uint_type val_boost;
  uintwide_t<256U,_unsigned_short,_void,_false> val_uintwide_t;
  uint i;
  value_type_conflict1 *msv_first;
  const_iterator __end1;
  const_iterator __begin1;
  array<bool,_2UL> *__range1;
  bool result_is_ok;
  
  uVar2 = util::util_pseudorandom_time_point_seed::value<unsigned_long>();
  std::
  discard_block_engine<std::subtract_with_carry_engine<unsigned_long,_24UL,_10UL,_24UL>,_223UL,_23UL>
  ::seed((discard_block_engine<std::subtract_with_carry_engine<unsigned_long,_24UL,_10UL,_24UL>,_223UL,_23UL>
          *)eng_sgn,uVar2);
  uVar2 = util::util_pseudorandom_time_point_seed::value<unsigned_long>();
  std::
  discard_block_engine<std::subtract_with_carry_engine<unsigned_long,_48UL,_5UL,_12UL>,_389UL,_11UL>
  ::seed((discard_block_engine<std::subtract_with_carry_engine<unsigned_long,_48UL,_5UL,_12UL>,_389UL,_11UL>
          *)eng_dig,uVar2);
  __range1._7_1_ = true;
  __end1 = std::array<bool,_2UL>::begin(&test_export_bits::msv_options);
  pvVar3 = std::array<bool,_2UL>::end(&test_export_bits::msv_options);
  for (; __end1 != pvVar3; __end1 = __end1 + 1) {
    val_uintwide_t.values.super_array<unsigned_short,_16UL>.elems[0xc] = 0;
    val_uintwide_t.values.super_array<unsigned_short,_16UL>.elems[0xd] = 0;
    for (; (uint)val_uintwide_t.values.super_array<unsigned_short,_16UL>.elems._24_4_ < 0x40;
        val_uintwide_t.values.super_array<unsigned_short,_16UL>.elems._24_4_ =
             val_uintwide_t.values.super_array<unsigned_short,_16UL>.elems._24_4_ + 1) {
      this = &val_boost.m_backend.
              super_cpp_int_base<256U,_256U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
              .field_0x2c;
      generate_wide_integer_value<math::wide_integer::uintwide_t<256u,unsigned_short,void,false>>
                ((uintwide_t<256U,_unsigned_short,_void,_false> *)this,(test_uintwide_t_edge *)0x1,
                 false,0x4d,in_R8D);
      math::wide_integer::to_string<256u,unsigned_short,void,false>
                (&local_a8,(wide_integer *)this,x);
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_int_backend<256u,256u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)0>
      ::number<std::__cxx11::string>
                ((number<boost::multiprecision::backends::cpp_int_backend<256u,256u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)0>
                  *)local_88,&local_a8,(type *)0x0);
      std::__cxx11::string::~string((string *)&local_a8);
      memset(bits_result_from_boost._M_elems + 0xc,0,0x20);
      memset((void *)((long)&__range1_1 + 4),0,0x20);
      pvVar4 = std::array<unsigned_short,_16UL>::begin
                         ((array<unsigned_short,_16UL> *)(bits_result_from_boost._M_elems + 0xc));
      math::wide_integer::export_bits<unsigned_short_*,_256U,_unsigned_short,_void,_false,_nullptr>
                ((uintwide_t<256U,_unsigned_short,_void,_false> *)
                 &val_boost.m_backend.
                  super_cpp_int_base<256U,_256U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
                  .field_0x2c,pvVar4,0x10,(bool)(*__end1 & 1));
      pvVar4 = std::array<unsigned_short,_16UL>::begin
                         ((array<unsigned_short,_16UL> *)((long)&__range1_1 + 4));
      boost::multiprecision::
      export_bits<256u,256u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void,(boost::multiprecision::expression_template_option)0,unsigned_short*>
                ((number<boost::multiprecision::backends::cpp_int_backend<256U,_256U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)local_88,pvVar4,0x10,(bool)(*__end1 & 1));
      __first1 = std::array<unsigned_short,_16UL>::cbegin
                           ((array<unsigned_short,_16UL> *)(bits_result_from_boost._M_elems + 0xc));
      __last1 = std::array<unsigned_short,_16UL>::cend
                          ((array<unsigned_short,_16UL> *)(bits_result_from_boost._M_elems + 0xc));
      __first2 = std::array<unsigned_short,_16UL>::cbegin
                           ((array<unsigned_short,_16UL> *)((long)&__range1_1 + 4));
      __range1_1._3_1_ =
           std::equal<unsigned_short_const*,unsigned_short_const*>(__first1,__last1,__first2);
      local_3b1 = false;
      if ((bool)__range1_1._3_1_) {
        local_3b1 = __range1._7_1_;
      }
      __range1._7_1_ = local_3b1;
    }
  }
  __end1_1 = std::array<bool,_2UL>::begin(&test_export_bits::msv_options);
  pvVar3 = std::array<bool,_2UL>::end(&test_export_bits::msv_options);
  for (; __end1_1 != pvVar3; __end1_1 = __end1_1 + 1) {
    __end2 = std::array<unsigned_int,_3UL>::begin(&test_export_bits::bits_for_chunks);
    pvVar5 = std::array<unsigned_int,_3UL>::end(&test_export_bits::bits_for_chunks);
    for (; __end2 != pvVar5; __end2 = __end2 + 1) {
      stack0xfffffffffffffec8 = __end2;
      val_uintwide_t_1.values.super_array<unsigned_short,_16UL>.elems[0xc] = 0;
      val_uintwide_t_1.values.super_array<unsigned_short,_16UL>.elems[0xd] = 0;
      for (; (uint)val_uintwide_t_1.values.super_array<unsigned_short,_16UL>.elems._24_4_ < 0x40;
          val_uintwide_t_1.values.super_array<unsigned_short,_16UL>.elems._24_4_ =
               val_uintwide_t_1.values.super_array<unsigned_short,_16UL>.elems._24_4_ + 1) {
        generate_wide_integer_value<math::wide_integer::uintwide_t<256u,unsigned_short,void,false>>
                  ((uintwide_t<256U,_unsigned_short,_void,_false> *)local_15c,
                   (test_uintwide_t_edge *)0x1,false,0x4d,in_R8D);
        math::wide_integer::to_string<256u,unsigned_short,void,false>
                  ((string *)local_1b8,(wide_integer *)local_15c,x_00);
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_int_backend<256u,256u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)0>
        ::number<std::__cxx11::string>
                  ((number<boost::multiprecision::backends::cpp_int_backend<256u,256u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)0>
                    *)local_198,(string *)local_1b8,(type *)0x0);
        std::__cxx11::string::~string((string *)local_1b8);
        puVar6 = (pointer)((long)(int)(0x100 / (long)(int)*stack0xfffffffffffffec8) +
                          (ulong)((int)(0x100 % (long)(int)*stack0xfffffffffffffec8) != 0));
        bits_result_from_boost_1.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._6_2_ = 0;
        this_00 = (allocator<unsigned_short> *)
                  ((long)&bits_result_from_boost_1.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage + 5);
        bits_result_from_uintwide_t_1.
        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = puVar6;
        std::allocator<unsigned_short>::allocator(this_00);
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
                  ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_1e0,
                   (size_type)puVar6,
                   (value_type_conflict3 *)
                   ((long)&bits_result_from_boost_1.
                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage + 6),this_00);
        std::allocator<unsigned_short>::~allocator
                  ((allocator<unsigned_short> *)
                   ((long)&bits_result_from_boost_1.
                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage + 5));
        puVar6 = bits_result_from_uintwide_t_1.
                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        local_202 = 0;
        std::allocator<unsigned_short>::allocator(&local_203);
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
                  ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_200,
                   (size_type)puVar6,&local_202,&local_203);
        std::allocator<unsigned_short>::~allocator(&local_203);
        iVar7 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::begin
                          ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_1e0);
        math::wide_integer::
        export_bits<__gnu_cxx::__normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>,_256U,_unsigned_short,_void,_false,_nullptr>
                  ((uintwide_t<256U,_unsigned_short,_void,_false> *)local_15c,
                   (__normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                    )iVar7._M_current,*stack0xfffffffffffffec8,(bool)(*__end1_1 & 1));
        iVar7 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::begin
                          ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_200);
        boost::multiprecision::
        export_bits<256u,256u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void,(boost::multiprecision::expression_template_option)0,__gnu_cxx::__normal_iterator<unsigned_short*,std::vector<unsigned_short,std::allocator<unsigned_short>>>>
                  ((number<boost::multiprecision::backends::cpp_int_backend<256U,_256U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)local_198,
                   (__normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                    )iVar7._M_current,*stack0xfffffffffffffec8,(bool)(*__end1_1 & 1));
        __first1_00 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::cbegin
                                ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                                 local_1e0);
        __last1_00 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::cend
                               ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_1e0
                               );
        __first2_00 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::cbegin
                                ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                                 local_200);
        bVar1 = std::
                equal<__gnu_cxx::__normal_iterator<unsigned_short_const*,std::vector<unsigned_short,std::allocator<unsigned_short>>>,__gnu_cxx::__normal_iterator<unsigned_short_const*,std::vector<unsigned_short,std::allocator<unsigned_short>>>>
                          ((__normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                            )__first1_00._M_current,
                           (__normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                            )__last1_00._M_current,
                           (__normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                            )__first2_00._M_current);
        local_429 = false;
        if (bVar1) {
          local_429 = __range1._7_1_;
        }
        __range1._7_1_ = local_429;
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
                  ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_200);
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
                  ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_1e0);
      }
    }
  }
  __end1_2 = std::array<bool,_2UL>::begin(&test_export_bits::msv_options);
  pvVar3 = std::array<bool,_2UL>::end(&test_export_bits::msv_options);
  for (; __end1_2 != pvVar3; __end1_2 = __end1_2 + 1) {
    stack0xfffffffffffffd98 = __end1_2;
    val_uintwide_t_2.values.super_array<unsigned_short,_16UL>.elems[0xc] = 0;
    val_uintwide_t_2.values.super_array<unsigned_short,_16UL>.elems[0xd] = 0;
    for (; (uint)val_uintwide_t_2.values.super_array<unsigned_short,_16UL>.elems._24_4_ < 0x40;
        val_uintwide_t_2.values.super_array<unsigned_short,_16UL>.elems._24_4_ =
             val_uintwide_t_2.values.super_array<unsigned_short,_16UL>.elems._24_4_ + 1) {
      generate_wide_integer_value<math::wide_integer::uintwide_t<256u,unsigned_short,void,false>>
                ((uintwide_t<256U,_unsigned_short,_void,_false> *)local_28c,
                 (test_uintwide_t_edge *)0x1,false,0x4d,in_R8D);
      math::wide_integer::to_string<256u,unsigned_short,void,false>
                ((string *)(bits_result_double_width_from_uintwide_t._M_elems + 6),
                 (wide_integer *)local_28c,x_01);
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_int_backend<256u,256u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)0>
      ::number<std::__cxx11::string>
                ((number<boost::multiprecision::backends::cpp_int_backend<256u,256u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)0>
                  *)local_2c8,(string *)(bits_result_double_width_from_uintwide_t._M_elems + 6),
                 (type *)0x0);
      std::__cxx11::string::~string
                ((string *)(bits_result_double_width_from_uintwide_t._M_elems + 6));
      memset(bits_result_double_width_from_boost._M_elems + 6,0,0x20);
      memset(val_uintwide_t_3.values.super_array<unsigned_short,_16UL>.elems + 0xd,0,0x20);
      pvVar8 = std::array<unsigned_int,_8UL>::begin
                         ((array<unsigned_int,_8UL> *)
                          (bits_result_double_width_from_boost._M_elems + 6));
      math::wide_integer::export_bits<unsigned_int_*,_256U,_unsigned_short,_void,_false,_nullptr>
                ((uintwide_t<256U,_unsigned_short,_void,_false> *)local_28c,pvVar8,0x20,
                 (bool)(*stack0xfffffffffffffd98 & 1));
      pvVar8 = std::array<unsigned_int,_8UL>::begin
                         ((array<unsigned_int,_8UL> *)
                          (val_uintwide_t_3.values.super_array<unsigned_short,_16UL>.elems + 0xd));
      boost::multiprecision::
      export_bits<256u,256u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void,(boost::multiprecision::expression_template_option)0,unsigned_int*>
                ((number<boost::multiprecision::backends::cpp_int_backend<256U,_256U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)local_2c8,pvVar8,0x20,(bool)(*stack0xfffffffffffffd98 & 1));
      __first1_01 = std::array<unsigned_int,_8UL>::cbegin
                              ((array<unsigned_int,_8UL> *)
                               (bits_result_double_width_from_boost._M_elems + 6));
      __last1_01 = std::array<unsigned_int,_8UL>::cend
                             ((array<unsigned_int,_8UL> *)
                              (bits_result_double_width_from_boost._M_elems + 6));
      __first2_01 = std::array<unsigned_int,_8UL>::cbegin
                              ((array<unsigned_int,_8UL> *)
                               (val_uintwide_t_3.values.super_array<unsigned_short,_16UL>.elems +
                               0xd));
      val_uintwide_t_3.values.super_array<unsigned_short,_16UL>.elems[0xc]._1_1_ =
           std::equal<unsigned_int_const*,unsigned_int_const*>(__first1_01,__last1_01,__first2_01);
      local_449 = false;
      if ((bool)val_uintwide_t_3.values.super_array<unsigned_short,_16UL>.elems[0xc]._1_1_) {
        local_449 = __range1._7_1_;
      }
      __range1._7_1_ = local_449;
    }
  }
  math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_true>::uintwide_t<int>
            ((uintwide_t<256U,_unsigned_short,_void,_true> *)local_34a,-1,
             (enable_if_t<(std::is_integral<int>::value_&&_std::is_signed<int>::value)> *)0x0);
  result_one_boost = 1;
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_int_backend<256U,_256U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
  ::number<int>((number<boost::multiprecision::backends::cpp_int_backend<256U,_256U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)&result_one_uintwide_t,(int *)&result_one_boost,(type *)0x0);
  uStack_390 = 0;
  local_394 = 0;
  math::wide_integer::export_bits<unsigned_int_*,_256U,_unsigned_short,_void,_true,_nullptr>
            ((uintwide_t<256U,_unsigned_short,_void,_true> *)local_34a,&stack0xfffffffffffffc70,0x20
             ,true);
  boost::multiprecision::
  export_bits<256u,256u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void,(boost::multiprecision::expression_template_option)0,unsigned_int*>
            ((number<boost::multiprecision::backends::cpp_int_backend<256U,_256U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
              *)&result_one_uintwide_t,&local_394,0x20,true);
  local_462 = false;
  if (uStack_390 == local_394 && uStack_390 == 1) {
    local_462 = __range1._7_1_;
  }
  return local_462;
}

Assistant:

auto test_export_bits() -> bool // NOLINT(readability-function-cognitive-complexity)
{
  eng_sgn.seed(util::util_pseudorandom_time_point_seed::value<typename eng_sgn_type::result_type>());
  eng_dig.seed(util::util_pseudorandom_time_point_seed::value<typename eng_dig_type::result_type>());

  using local_boost_small_uint_backend_type =
    boost::multiprecision::cpp_int_backend<local_edge_cases::local_digits2_small,
                                           local_edge_cases::local_digits2_small,
                                           boost::multiprecision::unsigned_magnitude,
                                           boost::multiprecision::unchecked,
                                           void>;

  using local_boost_small_uint_type =
    boost::multiprecision::number<local_boost_small_uint_backend_type,
                                  boost::multiprecision::et_off>;

  auto result_is_ok = true;

  static const std::array<bool, static_cast<std::size_t>(UINT8_C(2))> msv_options = { true, false };

  for(const auto& msv_first : msv_options) // NOLINT
  {
    for(auto   i = static_cast<unsigned>(UINT8_C(0));
               i < static_cast<unsigned>(loop_count_lo);
             ++i)
    {
      // Verify export_bits() and compare with Boost control value(s).
      // The input and output ranges have elements having the same widths.
      // Use the full bit width and representation length of uintwide_t.

      using local_representation_type = typename local_uintwide_t_small_unsigned_type::representation_type;

      using local_input_value_type = typename local_representation_type::value_type;

      using std::to_string;

            auto val_uintwide_t = generate_wide_integer_value<local_uintwide_t_small_unsigned_type>();
      const auto val_boost      = local_boost_small_uint_type(to_string(val_uintwide_t));

      using local_output_array_type =
        std::array<local_input_value_type, local_uintwide_t_small_unsigned_type::number_of_limbs>;

      using local_result_value_type = typename local_output_array_type::value_type;

      local_output_array_type bits_result_from_uintwide_t { };
      local_output_array_type bits_result_from_boost      { };

      static_cast<void>(export_bits(val_uintwide_t, bits_result_from_uintwide_t.begin(), static_cast<unsigned>(std::numeric_limits<local_result_value_type>::digits), msv_first));
      static_cast<void>(export_bits(val_boost,      bits_result_from_boost.begin(),      static_cast<unsigned>(std::numeric_limits<local_result_value_type>::digits), msv_first)); // NOLINT

      const auto result_export_bits_is_ok = std::equal(bits_result_from_uintwide_t.cbegin(),
                                                       bits_result_from_uintwide_t.cend(),
                                                       bits_result_from_boost.cbegin());

      result_is_ok = (result_export_bits_is_ok && result_is_ok);
    }
  }

  for(const auto& msv_first : msv_options) // NOLINT
  {
    static const std::array<unsigned, static_cast<std::size_t>(UINT8_C(3))> bits_for_chunks = { 7U, 9U, 15U };

    for(const auto& chunk_size : bits_for_chunks)
    {
      for(auto   i = static_cast<unsigned>(UINT8_C(0));
                 i < static_cast<unsigned>(loop_count_lo);
               ++i)
      {
        // Verify export_bits() and compare with Boost control value(s).
        // The input and output ranges have elements having the same widths.
        // Use various input bit counts less than the result limb's width.
        // Use the full size of elements in the wide integer for the
        // distance of the input range.

        using local_representation_type = typename local_uintwide_t_small_unsigned_type::representation_type;

        using local_input_value_type = typename local_representation_type::value_type;

        using std::to_string;

              auto val_uintwide_t = generate_wide_integer_value<local_uintwide_t_small_unsigned_type>();
        const auto val_boost      = local_boost_small_uint_type(to_string(val_uintwide_t));

        using local_output_vector_type = std::vector<local_input_value_type>;

        using local_result_value_type = typename local_output_vector_type::value_type;

        const auto output_distance_chunk_size_has_mod =
        (
          static_cast<int>
          (
            std::numeric_limits<local_uintwide_t_small_unsigned_type>::digits % static_cast<int>(chunk_size)
          ) != 0
        );

        const auto output_distance =
          static_cast<std::size_t>
          (
              static_cast<std::size_t>(std::numeric_limits<local_uintwide_t_small_unsigned_type>::digits / static_cast<int>(chunk_size))
            + static_cast<std::size_t>
              (
                output_distance_chunk_size_has_mod ? static_cast<std::size_t>(UINT8_C(1))
                                                   : static_cast<std::size_t>(UINT8_C(0))
              )
          );

        local_output_vector_type bits_result_from_uintwide_t(output_distance, static_cast<local_result_value_type>(UINT8_C(0)));
        local_output_vector_type bits_result_from_boost     (output_distance, static_cast<local_result_value_type>(UINT8_C(0)));

        static_cast<void>(export_bits(val_uintwide_t, bits_result_from_uintwide_t.begin(), chunk_size, msv_first));
        static_cast<void>(export_bits(val_boost,      bits_result_from_boost.begin(),      chunk_size, msv_first)); // NOLINT

        const auto result_export_bits_is_ok = std::equal(bits_result_from_uintwide_t.cbegin(),
                                                         bits_result_from_uintwide_t.cend(),
                                                         bits_result_from_boost.cbegin());

        result_is_ok = (result_export_bits_is_ok && result_is_ok);
      }
    }
  }

  for(const auto& msv_first : msv_options) // NOLINT
  {
    for(auto   i = static_cast<unsigned>(UINT8_C(0));
               i < static_cast<unsigned>(loop_count_lo);
             ++i)
    {
      // Verify export_bits() and compare with Boost control value(s).
      // The input and output ranges have elements having different widths.
      // Use various input bit counts exceeding the result limb's width.
      // Use the full size of elements in the wide integer for the
      // distance of the input range.

      using local_representation_type = typename local_uintwide_t_small_unsigned_type::representation_type;

      using local_input_value_type = typename local_representation_type::value_type;

      using std::to_string;

            auto val_uintwide_t = generate_wide_integer_value<local_uintwide_t_small_unsigned_type>();
      const auto val_boost      = local_boost_small_uint_type(to_string(val_uintwide_t));

      #if defined(WIDE_INTEGER_NAMESPACE)
      using local_result_double_width_value_type =
        typename WIDE_INTEGER_NAMESPACE::math::wide_integer::detail::uint_type_helper<static_cast<std::size_t>(std::numeric_limits<local_input_value_type>::digits * 2)>::exact_unsigned_type;
      #else
      using local_result_double_width_value_type =
        typename ::math::wide_integer::detail::uint_type_helper<static_cast<std::size_t>(std::numeric_limits<local_input_value_type>::digits * 2)>::exact_unsigned_type;
      #endif

      using local_double_width_output_array_type =
        std::array<local_result_double_width_value_type, local_uintwide_t_small_unsigned_type::number_of_limbs / 2U>;

      local_double_width_output_array_type bits_result_double_width_from_uintwide_t { };
      local_double_width_output_array_type bits_result_double_width_from_boost      { };

      static_cast<void>(export_bits(val_uintwide_t, bits_result_double_width_from_uintwide_t.begin(), static_cast<unsigned>(std::numeric_limits<local_result_double_width_value_type>::digits), msv_first));
      static_cast<void>(export_bits(val_boost,      bits_result_double_width_from_boost.begin(),      static_cast<unsigned>(std::numeric_limits<local_result_double_width_value_type>::digits), msv_first)); // NOLINT

      const auto result_export_bits_is_ok = std::equal(bits_result_double_width_from_uintwide_t.cbegin(),
                                                       bits_result_double_width_from_uintwide_t.cend(),
                                                       bits_result_double_width_from_boost.cbegin());

      result_is_ok = (result_export_bits_is_ok && result_is_ok);
    }
  }

  {
    // Note that export_bits uses the absolute value.
    // So test this feature by using negative one here.
    const auto val_uintwide_t = local_uintwide_t_small_signed_type(-1);
    const auto val_boost      = local_boost_small_uint_type(1);

    using local_result_type = std::uint32_t;

    auto result_one_uintwide_t = local_result_type { };
    auto result_one_boost      = local_result_type { };

    static_cast<void>(export_bits(val_uintwide_t, &result_one_uintwide_t, static_cast<unsigned>(std::numeric_limits<local_result_type>::digits)));
    static_cast<void>(export_bits(val_boost,      &result_one_boost,      static_cast<unsigned>(std::numeric_limits<local_result_type>::digits)));

    const auto result_is_one_and_compare_one_is_ok = (   (result_one_uintwide_t == result_one_boost)
                                                      && (result_one_uintwide_t == 1));

    result_is_ok = (result_is_one_and_compare_one_is_ok && result_is_ok);
  }

  return result_is_ok;
}